

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O2

string * __thiscall
t_markdown_generator::escape_html
          (string *__return_storage_ptr__,t_markdown_generator *this,string *str)

{
  ulong uVar1;
  string *psVar2;
  input_type iVar3;
  ulong uVar4;
  byte *pbVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  ulong firstpos;
  long lVar8;
  byte bVar9;
  byte bVar10;
  string local_1d0;
  string *local_1b0;
  ostringstream result;
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  bVar9 = 0;
  bVar10 = 0x3f;
  firstpos = 0;
  do {
    uVar4 = str->_M_string_length;
    if (uVar4 <= firstpos) {
LAB_001f119e:
      std::__cxx11::stringbuf::str();
      psVar2 = local_1b0;
      escape_html_tags(local_1b0,this,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
      return psVar2;
    }
    for (lVar8 = 0; uVar1 = lVar8 + firstpos, uVar1 < uVar4; lVar8 = lVar8 + 1) {
      pbVar5 = (byte *)std::__cxx11::string::at((ulong)str);
      bVar10 = *pbVar5;
      bVar9 = bVar10;
      if ((char)bVar10 < ' ') break;
      uVar4 = str->_M_string_length;
    }
    if (firstpos < uVar1) {
      std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
      std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      firstpos = uVar1;
    }
    if (str->_M_string_length <= firstpos) goto LAB_001f119e;
    if (bVar9 < 0x20) {
      if ((bVar10 < 0xe) && ((0x2600U >> (bVar10 & 0x1f) & 1) != 0)) {
        std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,' ');
      }
    }
    else {
      iVar3 = this->input_type_;
      if (iVar3 == INPUT_UNKNOWN) {
        detect_input_encoding(this,str,firstpos);
        iVar3 = this->input_type_;
        if (iVar3 == INPUT_UTF8) {
          std::__cxx11::string::substr((ulong)&local_1d0,(ulong)str);
          std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,
                          (string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          goto LAB_001f119e;
        }
      }
      if (iVar3 != INPUT_PLAIN) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = "Unexpected or unrecognized input encoding";
        __cxa_throw(puVar7,&char_const*::typeinfo,0);
      }
      poVar6 = std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,"&#");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,";");
    }
    firstpos = firstpos + 1;
  } while( true );
}

Assistant:

std::string t_markdown_generator::escape_html(std::string const& str) {
  // the generated HTML header says it is UTF-8 encoded
  // if UTF-8 input has been detected before, we don't need to change anything
  //if (input_type_ == INPUT_UTF8) {
  //  return escape_html_tags(str);
  //}

  // convert unsafe chars to their &#<num>; equivalent
  std::ostringstream result;
  unsigned char c = '?';
  unsigned int ic = 0;
  size_t lastpos;
  size_t firstpos = 0;
  while (firstpos < str.length()) {

    // look for non-ASCII char
    lastpos = firstpos;
    while (lastpos < str.length()) {
      c = str.at(lastpos);
      ic = c;
      if ((32 > ic) || (127 < ic)) {
        break;
      }
      ++lastpos;
    }

    // copy what we got so far
    if (lastpos > firstpos) {
      result << str.substr(firstpos, lastpos - firstpos);
      firstpos = lastpos;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // some control code?
    if (ic <= 31) {
      switch (c) {
      case '\r':
      case '\n':
      case '\t':
        result << ' ';
        break;
      default: // silently consume all other ctrl chars
        break;
      }
      ++firstpos;
      continue;
    }

    // reached the end?
    if (firstpos >= str.length()) {
      break;
    }

    // try to detect input encoding
    if (input_type_ == INPUT_UNKNOWN) {
      detect_input_encoding(str, firstpos);
      if (input_type_ == INPUT_UTF8) {
        lastpos = str.length();
        result << str.substr(firstpos, lastpos - firstpos);
        break;
      }
    }

    // convert the character to something useful based on the detected encoding
    switch (input_type_) {
    case INPUT_PLAIN:
      result << "&#" << ic << ";";
      ++firstpos;
      break;
    default:
      throw "Unexpected or unrecognized input encoding";
    }
  }

  return escape_html_tags(result.str());
}